

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImStb::STB_TEXTEDIT_LAYOUTROW(StbTexteditRow *r,ImGuiInputTextState *obj,int line_start_idx)

{
  ImWchar *text_begin;
  undefined8 uVar1;
  float fVar2;
  unsigned_short *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool in_R8B;
  ImVec2 IVar6;
  undefined8 extraout_XMM0_Qb;
  ImWchar *text_remaining;
  
  puVar3 = (obj->TextW).Data;
  text_remaining = (ImWchar *)0x0;
  text_begin = puVar3 + line_start_idx;
  IVar6 = InputTextCalcTextSizeW
                    (text_begin,puVar3 + obj->CurLenW,&text_remaining,(ImVec2 *)0x1,in_R8B);
  r->x0 = 0.0;
  auVar4._8_8_ = extraout_XMM0_Qb;
  auVar4._0_4_ = IVar6.x;
  auVar4._4_4_ = IVar6.y;
  uVar1 = vmovlps_avx(auVar4);
  r->x1 = (float)(int)uVar1;
  r->baseline_y_delta = (float)(int)((ulong)uVar1 >> 0x20);
  r->ymin = 0.0;
  auVar5._8_8_ = extraout_XMM0_Qb;
  auVar5._0_4_ = IVar6.x;
  auVar5._4_4_ = IVar6.y;
  fVar2 = (float)vextractps_avx(auVar5,1);
  r->ymax = fVar2;
  r->num_chars = (int)((ulong)((long)text_remaining - (long)text_begin) >> 1);
  return;
}

Assistant:

static void    STB_TEXTEDIT_LAYOUTROW(StbTexteditRow* r, STB_TEXTEDIT_STRING* obj, int line_start_idx)
{
    const ImWchar* text = obj->TextW.Data;
    const ImWchar* text_remaining = NULL;
    const ImVec2 size = InputTextCalcTextSizeW(text + line_start_idx, text + obj->CurLenW, &text_remaining, NULL, true);
    r->x0 = 0.0f;
    r->x1 = size.x;
    r->baseline_y_delta = size.y;
    r->ymin = 0.0f;
    r->ymax = size.y;
    r->num_chars = (int)(text_remaining - (text + line_start_idx));
}